

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LoopStatements.cpp
# Opt level: O0

ER __thiscall slang::ast::ForLoopStatement::evalImpl(ForLoopStatement *this,EvalContext *context)

{
  bool bVar1;
  reference ppEVar2;
  SourceLocation *pSVar3;
  long in_RDI;
  Expression *step;
  iterator __end3;
  iterator __begin3;
  span<const_slang::ast::Expression_*const,_18446744073709551615UL> *__range3;
  ER result;
  ConstantValue result_1;
  Expression *init;
  iterator __end2;
  iterator __begin2;
  span<const_slang::ast::Expression_*const,_18446744073709551615UL> *__range2;
  EvalContext *in_stack_fffffffffffffec8;
  undefined7 in_stack_fffffffffffffed0;
  byte in_stack_fffffffffffffed7;
  Expression *in_stack_fffffffffffffed8;
  Expression local_e8;
  Expression **local_b8;
  __normal_iterator<const_slang::ast::Expression_*const_*,_std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>_>
  local_b0;
  long local_a8;
  ER local_a0;
  int local_9c;
  Expression *local_38;
  Expression **local_30;
  __normal_iterator<const_slang::ast::Expression_*const_*,_std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>_>
  local_28;
  long local_20;
  ER local_4;
  
  local_20 = in_RDI + 0x20;
  local_28._M_current =
       (Expression **)
       std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>::begin
                 ((span<const_slang::ast::Expression_*const,_18446744073709551615UL> *)
                  in_stack_fffffffffffffec8);
  local_30 = (Expression **)
             std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>::end
                       ((span<const_slang::ast::Expression_*const,_18446744073709551615UL> *)
                        in_stack_fffffffffffffed8);
  while (bVar1 = __gnu_cxx::
                 operator==<const_slang::ast::Expression_*const_*,_std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>_>
                           ((__normal_iterator<const_slang::ast::Expression_*const_*,_std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>_>
                             *)CONCAT17(in_stack_fffffffffffffed7,in_stack_fffffffffffffed0),
                            (__normal_iterator<const_slang::ast::Expression_*const_*,_std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>_>
                             *)in_stack_fffffffffffffec8), ((bVar1 ^ 0xffU) & 1) != 0) {
    ppEVar2 = __gnu_cxx::
              __normal_iterator<const_slang::ast::Expression_*const_*,_std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>_>
              ::operator*(&local_28);
    local_38 = *ppEVar2;
    Expression::eval(in_stack_fffffffffffffed8,
                     (EvalContext *)CONCAT17(in_stack_fffffffffffffed7,in_stack_fffffffffffffed0));
    bVar1 = slang::ConstantValue::operator_cast_to_bool((ConstantValue *)0xa6369e);
    slang::ConstantValue::~ConstantValue((ConstantValue *)0xa636bb);
    if (((bVar1 ^ 0xffU) & 1) != 0) {
      return Fail;
    }
    __gnu_cxx::
    __normal_iterator<const_slang::ast::Expression_*const_*,_std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>_>
    ::operator++(&local_28);
  }
  do {
    if (*(long *)(in_RDI + 0x40) != 0) {
      Expression::eval(in_stack_fffffffffffffed8,
                       (EvalContext *)CONCAT17(in_stack_fffffffffffffed7,in_stack_fffffffffffffed0))
      ;
      bVar1 = slang::ConstantValue::bad((ConstantValue *)0xa6374e);
      if (bVar1) {
        local_4 = Fail;
        local_9c = 1;
      }
      else {
        bVar1 = slang::ConstantValue::isTrue
                          ((ConstantValue *)
                           CONCAT17(in_stack_fffffffffffffed7,in_stack_fffffffffffffed0));
        if (bVar1) {
          local_9c = 0;
        }
        else {
          local_9c = 5;
        }
      }
      slang::ConstantValue::~ConstantValue((ConstantValue *)0xa637de);
      if (local_9c != 0) {
        if (local_9c != 1) {
          return Success;
        }
        return local_4;
      }
    }
    local_a0 = Statement::eval((Statement *)
                               CONCAT17(in_stack_fffffffffffffed7,in_stack_fffffffffffffed0),
                               in_stack_fffffffffffffec8);
    if (local_a0 != Success) {
      if (local_a0 == Break) {
        return Success;
      }
      if (local_a0 != Continue) {
        return local_a0;
      }
    }
    local_a8 = in_RDI + 0x48;
    local_b0._M_current =
         (Expression **)
         std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>::begin
                   ((span<const_slang::ast::Expression_*const,_18446744073709551615UL> *)
                    in_stack_fffffffffffffec8);
    local_b8 = (Expression **)
               std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>::end
                         ((span<const_slang::ast::Expression_*const,_18446744073709551615UL> *)
                          in_stack_fffffffffffffed8);
    while (bVar1 = __gnu_cxx::
                   operator==<const_slang::ast::Expression_*const_*,_std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>_>
                             ((__normal_iterator<const_slang::ast::Expression_*const_*,_std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>_>
                               *)CONCAT17(in_stack_fffffffffffffed7,in_stack_fffffffffffffed0),
                              (__normal_iterator<const_slang::ast::Expression_*const_*,_std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>_>
                               *)in_stack_fffffffffffffec8), ((bVar1 ^ 0xffU) & 1) != 0) {
      pSVar3 = (SourceLocation *)
               __gnu_cxx::
               __normal_iterator<const_slang::ast::Expression_*const_*,_std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>_>
               ::operator*(&local_b0);
      local_e8.sourceRange.endLoc = *pSVar3;
      in_stack_fffffffffffffed8 = &local_e8;
      Expression::eval(in_stack_fffffffffffffed8,
                       (EvalContext *)CONCAT17(in_stack_fffffffffffffed7,in_stack_fffffffffffffed0))
      ;
      bVar1 = slang::ConstantValue::operator_cast_to_bool((ConstantValue *)0xa638f2);
      in_stack_fffffffffffffed7 = bVar1 ^ 0xff;
      slang::ConstantValue::~ConstantValue((ConstantValue *)0xa6390c);
      if ((in_stack_fffffffffffffed7 & 1) != 0) {
        return Fail;
      }
      __gnu_cxx::
      __normal_iterator<const_slang::ast::Expression_*const_*,_std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>_>
      ::operator++(&local_b0);
    }
  } while( true );
}

Assistant:

ER ForLoopStatement::evalImpl(EvalContext& context) const {
    for (auto init : initializers) {
        if (!init->eval(context))
            return ER::Fail;
    }

    while (true) {
        if (stopExpr) {
            auto result = stopExpr->eval(context);
            if (result.bad())
                return ER::Fail;

            if (!result.isTrue())
                break;
        }

        ER result = body.eval(context);
        if (result != ER::Success) {
            if (result == ER::Break)
                break;
            else if (result != ER::Continue)
                return result;
        }

        for (auto step : steps) {
            if (!step->eval(context))
                return ER::Fail;
        }
    }

    return ER::Success;
}